

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O1

TPZVec<int_*> * __thiscall
TPZVec<int_*>::operator=(TPZVec<int_*> *this,initializer_list<int_*> *list)

{
  size_type sVar1;
  iterator ppiVar2;
  int **ppiVar3;
  long lVar4;
  
  (*this->_vptr_TPZVec[3])();
  sVar1 = list->_M_len;
  if (sVar1 != 0) {
    ppiVar2 = list->_M_array;
    ppiVar3 = this->fStore;
    lVar4 = 0;
    do {
      *(undefined8 *)((long)ppiVar3 + lVar4) = *(undefined8 *)((long)ppiVar2 + lVar4);
      lVar4 = lVar4 + 8;
    } while (sVar1 << 3 != lVar4);
  }
  return this;
}

Assistant:

TPZVec<T> &TPZVec<T>::operator=(const std::initializer_list<T> &list) {
	Resize(list.size());

	auto it = list.begin();
	auto it_end = list.end();
	auto *aux = fStore;

	for (; it != it_end; it++, aux++)
		*aux = *it;
	return *this;
}